

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O2

void gdImageGifCtx(gdImagePtr im,gdIOCtxPtr out)

{
  int w;
  int w_00;
  int iVar1;
  byte bVar2;
  int iVar3;
  gdImagePtr im_00;
  int iVar4;
  char *buf;
  long lVar5;
  GifCtx GStack_c510;
  
  iVar4 = im->interlace;
  if (im->trueColor == 0) {
    im_00 = (gdImagePtr)0x0;
  }
  else {
    im_00 = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    im = im_00;
    if (im_00 == (gdImagePtr)0x0) {
      return;
    }
  }
  iVar3 = colorstobpp(im->colorsTotal);
  w = im->sx;
  w_00 = im->sy;
  iVar1 = im->transparent;
  lVar5 = 0;
  memset(&GStack_c510.n_bits,0,0xc4c0);
  GStack_c510.in_count = 1;
  GStack_c510.CountDown = (long)w_00 * (long)w;
  GStack_c510.Pass = 0;
  GStack_c510.curx = 0;
  GStack_c510.cury = 0;
  buf = "GIF89a";
  if (iVar1 < 0) {
    buf = "GIF87a";
  }
  GStack_c510.Width = w;
  GStack_c510.Height = w_00;
  GStack_c510.Interlace = iVar4;
  gdPutBuf(buf,6,out);
  gifPutWord(w,out);
  gifPutWord(w_00,out);
  bVar2 = (byte)iVar3 - 1;
  gdPutC(bVar2 * '\x10' | bVar2 | 0x80,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  for (; (uint)lVar5 >> ((byte)iVar3 & 0x1f) == 0; lVar5 = lVar5 + 1) {
    gdPutC((uchar)im->red[lVar5],out);
    gdPutC((uchar)im->green[lVar5],out);
    gdPutC((uchar)im->blue[lVar5],out);
  }
  if (-1 < iVar1) {
    gdPutC('!',out);
    gdPutC(0xf9,out);
    gdPutC('\x04',out);
    gdPutC('\x01',out);
    gdPutC('\0',out);
    gdPutC('\0',out);
    gdPutC((uchar)iVar1,out);
    gdPutC('\0',out);
  }
  gdPutC(',',out);
  gifPutWord(0,out);
  gifPutWord(0,out);
  gifPutWord(w,out);
  gifPutWord(w_00,out);
  gdPutC((iVar4 != 0) << 6,out);
  iVar4 = 2;
  if (2 < iVar3) {
    iVar4 = iVar3;
  }
  gdPutC((uchar)iVar4,out);
  compress(iVar4 + 1,out,im,&GStack_c510);
  gdPutC('\0',out);
  gdPutC(';',out);
  if (im_00 != (gdImagePtr)0x0) {
    gdImageDestroy(im_00);
  }
  return;
}

Assistant:

static int _gdImageGifCtx(gdImagePtr im, gdIOCtxPtr out)
{
	gdImagePtr pim = 0, tim = im;
	int interlace, BitsPerPixel;
	interlace = im->interlace;

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
		acceptable result: mix down to a palette
		based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if(!pim) {
			return 1;
		}
		tim = pim;
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFEncode(
	    out, tim->sx, tim->sy, interlace, 0, tim->transparent, BitsPerPixel,
	    tim->red, tim->green, tim->blue, tim);

	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(	pim);
	}

	return 0;
}